

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O0

anon_enum_32
SCoro::Poll<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>
          (SCoro<PauseResume::Start,_PauseResume::Event> *obj)

{
  Result RVar1;
  common_fn_t p_Var2;
  size_t sVar3;
  SCoro<PauseResume::Start,_PauseResume::Event> *obj_local;
  
  p_Var2 = Impl::get<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>(obj);
  RVar1 = (*p_Var2)(obj);
  if (RVar1.value == Yield) {
    obj_local._4_4_ = Yield;
  }
  else if (RVar1.value == Next) {
    sVar3 = EboIndex<2UL>::Next(&obj->super_EboIndex<2UL>);
    obj_local._4_4_ = End;
    if (sVar3 < 2) {
      obj_local._4_4_ = Next;
    }
  }
  else {
    obj_local._4_4_ = End;
  }
  return obj_local._4_4_;
}

Assistant:

constexpr auto Poll(Obj & obj) noexcept
    {
        switch (Impl::get(obj)(obj).value)
        {
        case Result::Next:
            return obj.Next() < obj.count ? Result::Next : Result::End;
        case Result::Yield:
            return Result::Yield;    
        default:
            return Result::End;
        }
    }